

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_parserInternals(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing parserInternals : 30 of 87 functions ...\n");
  }
  iVar1 = test_inputPop();
  iVar2 = test_inputPush();
  iVar3 = test_namePop();
  iVar4 = test_namePush();
  iVar5 = test_nodePop();
  iVar6 = test_nodePush();
  iVar7 = test_xmlCheckLanguageID();
  iVar8 = test_xmlCopyChar();
  iVar9 = test_xmlCopyCharMultiByte();
  iVar10 = test_xmlCreateEntityParserCtxt();
  iVar11 = test_xmlCreateFileParserCtxt();
  iVar12 = test_xmlCreateMemoryParserCtxt();
  iVar13 = test_xmlCreateURLParserCtxt();
  iVar14 = test_xmlCurrentChar();
  iVar15 = test_xmlIsLetter();
  iVar16 = test_xmlNewEntityInputStream();
  iVar17 = test_xmlNewInputFromFile();
  iVar18 = test_xmlNewInputStream();
  iVar19 = test_xmlNewStringInputStream();
  iVar20 = test_xmlNextChar();
  iVar21 = test_xmlParserInputShrink();
  iVar22 = test_xmlPopInput();
  iVar23 = test_xmlPushInput();
  iVar24 = test_xmlSetEntityReferenceFunc();
  iVar25 = test_xmlSplitQName();
  iVar26 = test_xmlStringCurrentChar();
  iVar27 = test_xmlStringDecodeEntities();
  iVar28 = test_xmlStringLenDecodeEntities();
  iVar29 = test_xmlSwitchEncoding();
  iVar30 = test_xmlSwitchInputEncoding();
  iVar31 = test_xmlSwitchToEncoding();
  uVar32 = iVar31 + iVar30 + iVar29 + iVar28 + iVar27 + iVar26 + iVar25 + iVar24 + iVar23 + iVar22 +
                                                                                            iVar21 +
                                                                                            iVar20 +
                                                                                            iVar19 +
                                                                                            iVar18 +
                                                                                            iVar17 +
                                                                                            iVar16 +
                                                                                            iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar32 != 0) {
    printf("Module parserInternals: %d errors\n",(ulong)uVar32);
  }
  return uVar32;
}

Assistant:

static int
test_parserInternals(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing parserInternals : 30 of 87 functions ...\n");
    test_ret += test_inputPop();
    test_ret += test_inputPush();
    test_ret += test_namePop();
    test_ret += test_namePush();
    test_ret += test_nodePop();
    test_ret += test_nodePush();
    test_ret += test_xmlCheckLanguageID();
    test_ret += test_xmlCopyChar();
    test_ret += test_xmlCopyCharMultiByte();
    test_ret += test_xmlCreateEntityParserCtxt();
    test_ret += test_xmlCreateFileParserCtxt();
    test_ret += test_xmlCreateMemoryParserCtxt();
    test_ret += test_xmlCreateURLParserCtxt();
    test_ret += test_xmlCurrentChar();
    test_ret += test_xmlIsLetter();
    test_ret += test_xmlNewEntityInputStream();
    test_ret += test_xmlNewInputFromFile();
    test_ret += test_xmlNewInputStream();
    test_ret += test_xmlNewStringInputStream();
    test_ret += test_xmlNextChar();
    test_ret += test_xmlParserInputShrink();
    test_ret += test_xmlPopInput();
    test_ret += test_xmlPushInput();
    test_ret += test_xmlSetEntityReferenceFunc();
    test_ret += test_xmlSplitQName();
    test_ret += test_xmlStringCurrentChar();
    test_ret += test_xmlStringDecodeEntities();
    test_ret += test_xmlStringLenDecodeEntities();
    test_ret += test_xmlSwitchEncoding();
    test_ret += test_xmlSwitchInputEncoding();
    test_ret += test_xmlSwitchToEncoding();

    if (test_ret != 0)
	printf("Module parserInternals: %d errors\n", test_ret);
    return(test_ret);
}